

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_derive_public_key
              (mbedtls_pk_context *pk,uchar *d,size_t d_len,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_ecp_group *grp;
  int iVar1;
  mbedtls_ecp_keypair *eck;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t d_len_local;
  uchar *d_local;
  mbedtls_pk_context *pk_local;
  
  grp = (mbedtls_ecp_group *)pk->pk_ctx;
  iVar1 = mbedtls_ecp_mul(grp,(mbedtls_ecp_point *)&grp[1].P.s,(mbedtls_mpi *)(grp + 1),&grp->G,
                          f_rng,p_rng);
  return iVar1;
}

Assistant:

static int pk_derive_public_key(mbedtls_pk_context *pk,
                                const unsigned char *d, size_t d_len,
                                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret;
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_status_t status;
    (void) f_rng;
    (void) p_rng;
#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    (void) d;
    (void) d_len;

    status = psa_export_public_key(pk->priv_id, pk->pub_raw, sizeof(pk->pub_raw),
                                   &pk->pub_raw_len);
    ret = psa_pk_status_to_mbedtls(status);
#else /* MBEDTLS_PK_USE_PSA_EC_DATA */
    mbedtls_ecp_keypair *eck = (mbedtls_ecp_keypair *) pk->pk_ctx;
    unsigned char key_buf[MBEDTLS_PSA_MAX_EC_PUBKEY_LENGTH];
    size_t key_len;
    mbedtls_svc_key_id_t key_id = MBEDTLS_SVC_KEY_ID_INIT;
    psa_key_attributes_t key_attr = PSA_KEY_ATTRIBUTES_INIT;
    size_t curve_bits;
    psa_ecc_family_t curve = mbedtls_ecc_group_to_psa(eck->grp.id, &curve_bits);
    psa_status_t destruction_status;

    psa_set_key_type(&key_attr, PSA_KEY_TYPE_ECC_KEY_PAIR(curve));
    psa_set_key_usage_flags(&key_attr, PSA_KEY_USAGE_EXPORT);

    status = psa_import_key(&key_attr, d, d_len, &key_id);
    ret = psa_pk_status_to_mbedtls(status);
    if (ret != 0) {
        return ret;
    }

    status = psa_export_public_key(key_id, key_buf, sizeof(key_buf), &key_len);
    ret = psa_pk_status_to_mbedtls(status);
    destruction_status = psa_destroy_key(key_id);
    if (ret != 0) {
        return ret;
    } else if (destruction_status != PSA_SUCCESS) {
        return psa_pk_status_to_mbedtls(destruction_status);
    }
    ret = mbedtls_ecp_point_read_binary(&eck->grp, &eck->Q, key_buf, key_len);
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */
#else /* MBEDTLS_USE_PSA_CRYPTO */
    mbedtls_ecp_keypair *eck = (mbedtls_ecp_keypair *) pk->pk_ctx;
    (void) d;
    (void) d_len;

    ret = mbedtls_ecp_mul(&eck->grp, &eck->Q, &eck->d, &eck->grp.G, f_rng, p_rng);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
    return ret;
}